

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall
gimage::ImageIO::loadHeader(ImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  BasicImageIO *pBVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  exception *anon_var_0;
  long tborder;
  long theight;
  long twidth;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string suffix;
  string prefix;
  size_t pos;
  string s;
  long *in_stack_00000258;
  long *in_stack_00000260;
  string *in_stack_00000268;
  string *in_stack_00000270;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000278;
  BasicImageIO *in_stack_00000280;
  long *in_stack_00000290;
  long *in_stack_00000298;
  long *in_stack_000002a0;
  int *in_stack_000002a8;
  undefined1 in_stack_ffffffffffffff57;
  char *in_stack_ffffffffffffff58;
  ImageIO *in_stack_ffffffffffffff60;
  string local_88 [32];
  ulong local_68;
  allocator local_49;
  string local_48 [32];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  char *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RSI,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = std::__cxx11::string::rfind((char)local_48,0x3a);
  if (local_68 != 0xffffffffffffffff) {
    iVar1 = std::__cxx11::string::compare((ulong)local_48,local_68,(char *)0x2);
    if (iVar1 == 0) {
      local_68 = 0xffffffffffffffff;
    }
  }
  if (local_68 == 0xffffffffffffffff) {
    pBVar2 = getBasicImageIO(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (bool)in_stack_ffffffffffffff57);
    (*pBVar2->_vptr_BasicImageIO[4])(pBVar2,local_10,local_18,local_20,local_28);
  }
  else {
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_48);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff58,(ulong)local_48);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x12f902);
    getBasicImageIO(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    (bool)in_stack_ffffffffffffff57);
    anon_unknown_17::loadTiledHeader
              (in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
               in_stack_00000260,in_stack_00000258,in_stack_00000290,in_stack_00000298,
               in_stack_000002a0,in_stack_000002a8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12f98a);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void ImageIO::loadHeader(const char *name, long &width, long &height,
                         int &depth) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos != s.npos)
  {
    try
    {
      // extract prefix and suffix from file name

      std::string prefix=s.substr(0, pos);
      std::string suffix=s.substr(pos+1);

      // get header information

      std::set<std::string> list;
      long twidth;
      long theight;
      long tborder;

      loadTiledHeader(getBasicImageIO(name, true), list, prefix, suffix, twidth,
                      theight, tborder, width, height, depth);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image failes, try loading as normal image with colon in file name
      getBasicImageIO(name, true).loadHeader(name, width, height, depth);
    }
  }
  else
  {
    getBasicImageIO(name, true).loadHeader(name, width, height, depth);
  }
}